

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AttitudeQuaternionEKF.cpp
# Opt level: O2

bool __thiscall
iDynTree::AttitudeQuaternionEKF::ekf_h
          (AttitudeQuaternionEKF *this,VectorDynSize *xhat_k_plus_one,VectorDynSize *zhat_k_plus_one
          )

{
  double dVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  double dVar6;
  long lVar7;
  long lVar8;
  double *pdVar9;
  char *pcVar10;
  double dVar11;
  double dVar12;
  double dVar13;
  double dVar14;
  UnitQuaternion q;
  Map<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::Stride<0,_0>_> local_90;
  UnitQuaternion *local_78 [2];
  Block<Eigen::Map<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::Stride<0,_0>_>,_4,_1,_false>
  local_68;
  
  lVar7 = iDynTree::VectorDynSize::size();
  lVar8 = iDynTree::VectorDynSize::size();
  if (lVar7 == lVar8) {
    lVar7 = iDynTree::VectorDynSize::size();
    lVar8 = iDynTree::VectorDynSize::size();
    if (lVar7 == lVar8) {
      toEigen(&local_90,xhat_k_plus_one);
      local_68.
      super_BlockImpl<Eigen::Map<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::Stride<0,_0>_>,_4,_1,_false,_Eigen::Dense>
      .
      super_BlockImpl_dense<Eigen::Map<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::Stride<0,_0>_>,_4,_1,_false,_true>
      .
      super_MapBase<Eigen::Block<Eigen::Map<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::Stride<0,_0>_>,_4,_1,_false>,_0>
      .m_data = local_90.
                super_MapBase<Eigen::Map<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::Stride<0,_0>_>,_0>
                .m_data;
      local_68.
      super_BlockImpl<Eigen::Map<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::Stride<0,_0>_>,_4,_1,_false,_Eigen::Dense>
      .
      super_BlockImpl_dense<Eigen::Map<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::Stride<0,_0>_>,_4,_1,_false,_true>
      .m_xpr.
      super_MapBase<Eigen::Map<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::Stride<0,_0>_>,_0>
      .m_data = local_90.
                super_MapBase<Eigen::Map<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::Stride<0,_0>_>,_0>
                .m_data;
      local_68.
      super_BlockImpl<Eigen::Map<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::Stride<0,_0>_>,_4,_1,_false,_Eigen::Dense>
      .
      super_BlockImpl_dense<Eigen::Map<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::Stride<0,_0>_>,_4,_1,_false,_true>
      .m_xpr.
      super_MapBase<Eigen::Map<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::Stride<0,_0>_>,_0>
      .m_rows.m_value =
           local_90.
           super_MapBase<Eigen::Map<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::Stride<0,_0>_>,_0>
           .m_rows.m_value;
      local_68.
      super_BlockImpl<Eigen::Map<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::Stride<0,_0>_>,_4,_1,_false,_Eigen::Dense>
      .
      super_BlockImpl_dense<Eigen::Map<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::Stride<0,_0>_>,_4,_1,_false,_true>
      .m_xpr.
      super_MapBase<Eigen::Map<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::Stride<0,_0>_>,_0>
      ._16_1_ = local_90.
                super_MapBase<Eigen::Map<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::Stride<0,_0>_>,_0>
                ._16_1_;
      local_68.
      super_BlockImpl<Eigen::Map<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::Stride<0,_0>_>,_4,_1,_false,_Eigen::Dense>
      .
      super_BlockImpl_dense<Eigen::Map<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::Stride<0,_0>_>,_4,_1,_false,_true>
      .m_startRow.m_value = 0;
      local_68.
      super_BlockImpl<Eigen::Map<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::Stride<0,_0>_>,_4,_1,_false,_Eigen::Dense>
      .
      super_BlockImpl_dense<Eigen::Map<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::Stride<0,_0>_>,_4,_1,_false,_true>
      .m_outerStride =
           local_90.
           super_MapBase<Eigen::Map<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::Stride<0,_0>_>,_0>
           .m_rows.m_value;
      local_78[0] = &q;
      Eigen::internal::
      call_assignment<Eigen::Map<Eigen::Matrix<double,4,1,0,4,1>,0,Eigen::Stride<0,0>>,Eigen::Block<Eigen::Map<Eigen::Matrix<double,_1,1,0,_1,1>const,0,Eigen::Stride<0,0>>,4,1,false>>
                ((Map<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_0,_Eigen::Stride<0,_0>_> *)local_78,
                 &local_68);
      dVar6 = q.m_data[3];
      dVar5 = q.m_data[2];
      dVar4 = q.m_data[1];
      dVar3 = q.m_data[0];
      dVar1 = q.m_data[0] * q.m_data[2];
      dVar2 = q.m_data[1] * q.m_data[3];
      dVar11 = q.m_data[0] * q.m_data[0];
      dVar13 = q.m_data[1] * q.m_data[1];
      dVar12 = q.m_data[2] * q.m_data[2];
      dVar14 = q.m_data[3] * q.m_data[3];
      pdVar9 = (double *)iDynTree::VectorDynSize::operator()(zhat_k_plus_one,0);
      *pdVar9 = (dVar2 - dVar1) * -2.0;
      pdVar9 = (double *)iDynTree::VectorDynSize::operator()(zhat_k_plus_one,1);
      *pdVar9 = (dVar4 * dVar3 + dVar6 * dVar5) * -2.0;
      pdVar9 = (double *)iDynTree::VectorDynSize::operator()(zhat_k_plus_one,2);
      *pdVar9 = -(((dVar11 - dVar13) - dVar12) + dVar14);
      dVar1 = (this->m_gravity_direction).super_Vector3.m_data[2];
      if ((dVar1 != -1.0) || (NAN(dVar1))) {
        if ((dVar1 != 1.0) || (NAN(dVar1))) {
          pcVar10 = "filter assumes gravity pointing upward or downward only";
          goto LAB_001dc47c;
        }
        local_90.
        super_MapBase<Eigen::Map<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::Stride<0,_0>_>,_0>
        .m_data = (PointerType)0xbff0000000000000;
        toEigen((Map<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::Stride<0,_0>_> *)&local_68,
                zhat_k_plus_one);
        Eigen::
        DenseBase<Eigen::Map<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_0,_Eigen::Stride<0,_0>_>_>::
        operator*=((DenseBase<Eigen::Map<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::Stride<0,_0>_>_>
                    *)&local_68,(Scalar *)&local_90);
      }
      if (this->m_output_size != 4) {
        return true;
      }
      dVar1 = q.m_data[2] * q.m_data[1] + q.m_data[3] * q.m_data[0];
      dVar14 = dVar14 + dVar12;
      dVar1 = atan2(dVar1 + dVar1,1.0 - (dVar14 + dVar14));
      pdVar9 = (double *)iDynTree::VectorDynSize::operator()(zhat_k_plus_one,3);
      *pdVar9 = dVar1;
      return true;
    }
    pcVar10 = "output size mismatch";
  }
  else {
    pcVar10 = "predicted state size mismatch";
  }
LAB_001dc47c:
  iDynTree::reportError("AttitudeQuaternionEKF","h",pcVar10);
  return false;
}

Assistant:

bool iDynTree::AttitudeQuaternionEKF::ekf_h(const iDynTree::VectorDynSize& xhat_k_plus_one, iDynTree::VectorDynSize& zhat_k_plus_one)
{
    if (xhat_k_plus_one.size() != m_x.size())
    {
        reportError("AttitudeQuaternionEKF", "h", "predicted state size mismatch");
        return false;
    }

    if (zhat_k_plus_one.size() != m_y.size())
    {
        reportError("AttitudeQuaternionEKF", "h", "output size mismatch");
        return false;
    }

    // following computation is the same as R^T e_3
    iDynTree::UnitQuaternion q;
    toEigen(q) = toEigen(xhat_k_plus_one).block<4,1>(0, 0);
    double q1q3{q(1)*q(3)};
    double q0q2{q(0)*q(2)};
    double q2q3{q(2)*q(3)};
    double q0q1{q(0)*q(1)};
    double q0squared{q(0)*q(0)};
    double q1squared{q(1)*q(1)};
    double q2squared{q(2)*q(2)};
    double q3squared{q(3)*q(3)};

    zhat_k_plus_one(0) = -2*(q1q3 - q0q2);
    zhat_k_plus_one(1) = -2*(q2q3 + q0q1);
    zhat_k_plus_one(2) = -(q0squared - q1squared - q2squared + q3squared);
    if (m_gravity_direction(2) == -1)
    {
        // have same zhat
    }
    else if (m_gravity_direction(2) == 1)
    {
        toEigen(zhat_k_plus_one) *= -1;
    }
    else
    {
        reportError("AttitudeQuaternionEKF", "h", "filter assumes gravity pointing upward or downward only");
        return false;
    }

    // magnetometer measurement gives us yaw
    if (m_output_size == output_dimensions_with_magnetometer)
    {
        double q0q3{q(0)*q(3)};
        double q1q2{q(1)*q(2)};
        zhat_k_plus_one(3) = std::atan2(2*(q0q3+q1q2), 1 - 2*(q2squared + q3squared));
    }

    return true;
}